

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool Catch::replaceInPlace(string *str,string *replaceThis,string *withThis)

{
  undefined8 *puVar1;
  ulong uVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong uVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar2 = std::__cxx11::string::find((char *)str,(ulong)(replaceThis->_M_dataplus)._M_p,0);
  if (uVar2 != 0xffffffffffffffff) {
    uVar7 = uVar2;
    do {
      std::__cxx11::string::substr((ulong)local_50,(ulong)str);
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_50,(ulong)(withThis->_M_dataplus)._M_p);
      puVar6 = (ulong *)(plVar3 + 2);
      if ((ulong *)*plVar3 == puVar6) {
        local_80 = *puVar6;
        lStack_78 = plVar3[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *puVar6;
        local_90 = (ulong *)*plVar3;
      }
      local_88 = plVar3[1];
      *plVar3 = (long)puVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::substr((ulong)&local_b0,(ulong)str);
      uVar5 = 0xf;
      if (local_90 != &local_80) {
        uVar5 = local_80;
      }
      if (uVar5 < (ulong)(local_a8 + local_88)) {
        uVar5 = 0xf;
        if (local_b0 != local_a0) {
          uVar5 = local_a0[0];
        }
        if (uVar5 < (ulong)(local_a8 + local_88)) goto LAB_0013dbaf;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_90);
      }
      else {
LAB_0013dbaf:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0);
      }
      puVar1 = puVar4 + 2;
      if ((undefined8 *)*puVar4 == puVar1) {
        local_60 = *puVar1;
        uStack_58 = puVar4[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *puVar1;
        local_70 = (undefined8 *)*puVar4;
      }
      local_68 = puVar4[1];
      *puVar4 = puVar1;
      puVar4[1] = 0;
      *(undefined1 *)puVar1 = 0;
      std::__cxx11::string::operator=((string *)str,(string *)&local_70);
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_b0 != local_a0) {
        operator_delete(local_b0);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      uVar5 = 0xffffffffffffffff;
      if (uVar7 < str->_M_string_length - withThis->_M_string_length) {
        uVar5 = std::__cxx11::string::find
                          ((char *)str,(ulong)(replaceThis->_M_dataplus)._M_p,
                           withThis->_M_string_length + uVar7);
      }
      uVar7 = uVar5;
    } while (uVar5 != 0xffffffffffffffff);
  }
  return uVar2 != 0xffffffffffffffff;
}

Assistant:

bool replaceInPlace( std::string& str, std::string const& replaceThis, std::string const& withThis ) {
        bool replaced = false;
        std::size_t i = str.find( replaceThis );
        while( i != std::string::npos ) {
            replaced = true;
            str = str.substr( 0, i ) + withThis + str.substr( i+replaceThis.size() );
            if( i < str.size()-withThis.size() )
                i = str.find( replaceThis, i+withThis.size() );
            else
                i = std::string::npos;
        }
        return replaced;
    }